

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

bool __thiscall MidiInApi::MidiQueue::push(MidiQueue *this,MidiMessage *msg)

{
  uint uVar1;
  MidiMessage *pMVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->back;
  uVar3 = 0;
  if (uVar1 < this->front) {
    uVar3 = this->ringSize;
  }
  uVar3 = (uVar1 - this->front) + uVar3;
  uVar4 = this->ringSize - 1;
  if (uVar3 < uVar4) {
    pMVar2 = this->ring;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pMVar2[uVar1].bytes,&msg->bytes);
    pMVar2[uVar1].timeStamp = msg->timeStamp;
    this->back = (this->back + 1) % this->ringSize;
  }
  return uVar3 < uVar4;
}

Assistant:

unsigned int MidiInApi::MidiQueue::size( unsigned int *__back,
                                         unsigned int *__front )
{
  // Access back/front members exactly once and make stack copies for
  // size calculation
  unsigned int _back = back, _front = front, _size;
  if ( _back >= _front )
    _size = _back - _front;
  else
    _size = ringSize - _front + _back;

  // Return copies of back/front so no new and unsynchronized accesses
  // to member variables are needed.
  if ( __back ) *__back = _back;
  if ( __front ) *__front = _front;
  return _size;
}